

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

char * cimg_library::cimg::ftype(FILE *file,char *filename)

{
  char cVar1;
  uint mode;
  int iVar2;
  CImgArgumentException *this;
  uint *puVar3;
  char *pcVar4;
  CImg<char> *pCVar5;
  CImgIOException *anon_var_0;
  uint local_98;
  char c;
  int l;
  undefined1 local_70 [8];
  CImgList<char> _header;
  uchar *uheader;
  undefined1 local_50 [4];
  uint omode;
  CImg<char> header;
  char *f_type;
  char *filename_local;
  FILE *file_local;
  
  if ((file == (FILE *)0x0) && (filename == (char *)0x0)) {
    this = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this,"cimg::ftype(): Specified filename is (null).");
    __cxa_throw(this,&CImgArgumentException::typeinfo,CImgArgumentException::~CImgArgumentException)
    ;
  }
  header._data = (char *)0x0;
  CImg<char>::CImg((CImg<char> *)local_50);
  puVar3 = exception_mode();
  mode = *puVar3;
  exception_mode(0);
  CImg<char>::_load_raw((CImg<char> *)local_50,file,filename,0x200,1,1,1,false,false,0);
  _header._data = (CImg<char> *)header._16_8_;
  pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_50);
  iVar2 = strncmp(pcVar4,"OFF\n",4);
  if (iVar2 == 0) {
    header._data = "off";
  }
  else {
    pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_50);
    iVar2 = strncmp(pcVar4,"#INRIMAGE",9);
    if (iVar2 == 0) {
      header._data = "inr";
    }
    else {
      pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_50);
      iVar2 = strncmp(pcVar4,"PANDORE",7);
      if (iVar2 == 0) {
        header._data = "pan";
      }
      else {
        pcVar4 = CImg<char>::data((CImg<char> *)local_50);
        iVar2 = strncmp(pcVar4 + 0x80,"DICM",4);
        if (iVar2 == 0) {
          header._data = "dcm";
        }
        else if ((((char)(_header._data)->_width == -1) &&
                 (*(char *)((long)&(_header._data)->_width + 1) == -0x28)) &&
                (*(char *)((long)&(_header._data)->_width + 2) == -1)) {
          header._data = "jpg";
        }
        else {
          pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_50);
          if ((*pcVar4 == 'B') &&
             (pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_50),
             pcVar4[1] == 'M')) {
            header._data = "bmp";
          }
          else {
            pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_50);
            if (((*pcVar4 == 'G') &&
                ((pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_50),
                 pcVar4[1] == 'I' &&
                 (pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_50),
                 pcVar4[2] == 'F')))) &&
               ((pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_50),
                pcVar4[3] == '8' &&
                ((pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_50),
                 pcVar4[5] == 'a' &&
                 ((pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_50),
                  pcVar4[4] == '7' ||
                  (pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_50),
                  pcVar4[4] == '9')))))))) {
              header._data = "gif";
            }
            else if (((char)(_header._data)->_width == -0x77) &&
                    (((((*(char *)((long)&(_header._data)->_width + 1) == 'P' &&
                        (*(char *)((long)&(_header._data)->_width + 2) == 'N')) &&
                       (*(char *)((long)&(_header._data)->_width + 3) == 'G')) &&
                      (((char)(_header._data)->_height == '\r' &&
                       (*(char *)((long)&(_header._data)->_height + 1) == '\n')))) &&
                     ((*(char *)((long)&(_header._data)->_height + 2) == '\x1a' &&
                      (*(char *)((long)&(_header._data)->_height + 3) == '\n')))))) {
              header._data = "png";
            }
            else if ((((char)(_header._data)->_width == 'I') &&
                     (*(char *)((long)&(_header._data)->_width + 1) == 'I')) ||
                    (((char)(_header._data)->_width == 'M' &&
                     (*(char *)((long)&(_header._data)->_width + 1) == 'M')))) {
              header._data = "tif";
            }
            else {
              c = '\n';
              CImg<char>::vector((CImg<char> *)&l,&c);
              CImg<char>::get_split<char>
                        ((CImg<char> *)local_70,(CImg<char> *)local_50,(char)&l,false);
              CImg<char>::~CImg((CImg<char> *)&l);
              for (local_98 = 0; (int)local_98 < (int)local_70._0_4_; local_98 = local_98 + 1) {
                pcVar4 = CImgList<char>::operator()((CImgList<char> *)local_70,local_98,0,0,0,0);
                if (*pcVar4 != '#') {
                  pCVar5 = CImgList::operator_cast_to_CImg_((CImgList *)local_70);
                  if ((pCVar5[(int)local_98]._height == 2) &&
                     (pcVar4 = CImgList<char>::operator()
                                         ((CImgList<char> *)local_70,local_98,0,0,0,0),
                     *pcVar4 == 'P')) {
                    pcVar4 = CImgList<char>::operator()((CImgList<char> *)local_70,local_98,1,0,0,0)
                    ;
                    cVar1 = *pcVar4;
                    if ((cVar1 == 'f') || (cVar1 == 'F')) {
                      header._data = "pfm";
                      break;
                    }
                    if (('0' < cVar1) && (cVar1 < ':')) {
                      header._data = "pnm";
                      break;
                    }
                  }
                  header._data = (char *)0x0;
                  break;
                }
              }
              CImgList<char>::~CImgList((CImgList<char> *)local_70);
            }
          }
        }
      }
    }
  }
  exception_mode(mode);
  pcVar4 = header._data;
  CImg<char>::~CImg((CImg<char> *)local_50);
  return pcVar4;
}

Assistant:

inline const char *ftype(std::FILE *const file, const char *const filename) {
    if (!file && !filename)
      throw CImgArgumentException("cimg::ftype(): Specified filename is (null).");
    static const char
      *const _pnm = "pnm",
      *const _pfm = "pfm",
      *const _bmp = "bmp",
      *const _gif = "gif",
      *const _jpg = "jpg",
      *const _off = "off",
      *const _pan = "pan",
      *const _png = "png",
      *const _tif = "tif",
      *const _inr = "inr",
      *const _dcm = "dcm";
    const char *f_type = 0;
    CImg<char> header;
    const unsigned int omode = cimg::exception_mode();
    cimg::exception_mode(0);
    try {
      header._load_raw(file,filename,512,1,1,1,false,false,0);
      const unsigned char *const uheader = (unsigned char*)header._data;
      if (!std::strncmp(header,"OFF\n",4)) f_type = _off; // OFF.
      else if (!std::strncmp(header,"#INRIMAGE",9)) f_type = _inr; // INRIMAGE.
      else if (!std::strncmp(header,"PANDORE",7)) f_type = _pan; // PANDORE.
      else if (!std::strncmp(header.data() + 128,"DICM",4)) f_type = _dcm; // DICOM.
      else if (uheader[0]==0xFF && uheader[1]==0xD8 && uheader[2]==0xFF) f_type = _jpg;  // JPEG.
      else if (header[0]=='B' && header[1]=='M') f_type = _bmp;  // BMP.
      else if (header[0]=='G' && header[1]=='I' && header[2]=='F' && header[3]=='8' && header[5]=='a' && // GIF.
               (header[4]=='7' || header[4]=='9')) f_type = _gif;
      else if (uheader[0]==0x89 && uheader[1]==0x50 && uheader[2]==0x4E && uheader[3]==0x47 &&  // PNG.
               uheader[4]==0x0D && uheader[5]==0x0A && uheader[6]==0x1A && uheader[7]==0x0A) f_type = _png;
      else if ((uheader[0]==0x49 && uheader[1]==0x49) || (uheader[0]==0x4D && uheader[1]==0x4D)) f_type = _tif; // TIFF.
      else { // PNM or PFM.
        CImgList<char> _header = header.get_split(CImg<char>::vector('\n'),0,false);
        cimglist_for(_header,l) {
          if (_header(l,0)=='#') continue;
          if (_header[l]._height==2 && _header(l,0)=='P') {
            const char c = _header(l,1);
            if (c=='f' || c=='F') { f_type = _pfm; break; }
            if (c>='1' && c<='9') { f_type = _pnm; break; }
          }
          f_type = 0; break;
        }
      }
    } catch (CImgIOException&) { }
    cimg::exception_mode(omode);
    return f_type;
  }